

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::Runner::runTest(Totals *__return_storage_ptr__,Runner *this,TestCaseInfo *testInfo)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
  *this_00;
  Counts *pCVar1;
  size_t *psVar2;
  IReporter *pIVar3;
  TestCaseInfo *pTVar4;
  Totals *pTVar5;
  bool bVar6;
  int iVar7;
  RunningTest *pRVar8;
  IMutableContext *pIVar9;
  _Rb_tree_header *p_Var10;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string local_b0;
  string local_90;
  Totals *local_70;
  TestCaseInfo *local_68;
  Totals *local_60;
  Totals local_58;
  
  local_58.assertions.passed._0_4_ = (undefined4)(this->m_totals).assertions.passed;
  local_58.assertions.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  local_58.assertions.failed._0_4_ = (undefined4)(this->m_totals).assertions.failed;
  local_58.assertions.failed._4_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_58.testCases.passed._0_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_58.testCases.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_58.testCases.failed._0_4_ = (undefined4)(this->m_totals).testCases.failed;
  local_58.testCases.failed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,testInfo);
  pRVar8 = (RunningTest *)operator_new(0x68);
  local_70 = &this->m_totals;
  pRVar8->m_info = testInfo;
  pRVar8->m_runStatus = RanAtLeastOneSection;
  (pRVar8->m_rootSection).m_status = Root;
  p_Var10 = &(pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var10->_M_header;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var10->_M_header;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pRVar8->m_rootSection).m_parent = (SectionInfo *)0x0;
  pRVar8->m_currentSection = &pRVar8->m_rootSection;
  pRVar8->m_changed = false;
  this->m_runningTest = pRVar8;
  local_68 = testInfo;
  local_60 = __return_storage_ptr__;
LAB_00187dd8:
  do {
    pTVar4 = this->m_runningTest->m_info;
    std::__cxx11::string::_M_assign((string *)&(this->m_currentResult).super_ResultInfo.m_lineInfo);
    std::__cxx11::string::_M_assign
              ((string *)&(this->m_currentResult).super_ResultInfo.m_lineInfo.file);
    (this->m_currentResult).super_ResultInfo.m_lineInfo.line = (pTVar4->m_lineInfo).line;
    runCurrentTest(this,&local_90,&local_b0);
    pRVar8 = this->m_runningTest;
    if ((pRVar8->m_runStatus == RanAtLeastOneSection) ||
       ((bVar6 = SectionInfo::hasUntestedSections(&pRVar8->m_rootSection), bVar6 &&
        (pRVar8->m_changed == true)))) {
      if ((this->m_totals).assertions.failed != (long)(this->m_config->m_data).cutoff)
      goto LAB_00187dd8;
    }
    pIVar9 = getCurrentMutableContext();
    iVar7 = (*(pIVar9->super_IContext)._vptr_IContext[5])(pIVar9);
    if (((char)iVar7 == '\0') ||
       ((this->m_totals).assertions.failed == (long)(this->m_config->m_data).cutoff)) {
      pRVar8 = this->m_runningTest;
      if (pRVar8 != (RunningTest *)0x0) {
        this_00 = &(pRVar8->m_rootSection).m_subSections;
        deleteAllValues<std::map<std::__cxx11::string,Catch::SectionInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>>
                  (this_00);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
        ::~_Rb_tree(&this_00->_M_t);
        operator_delete(pRVar8,0x68);
      }
      pTVar5 = local_60;
      this->m_runningTest = (RunningTest *)0x0;
      Totals::delta(local_60,local_70,&local_58);
      pCVar1 = &(this->m_totals).testCases;
      pCVar1->passed = pCVar1->passed + (pTVar5->testCases).passed;
      psVar2 = &(this->m_totals).testCases.failed;
      *psVar2 = *psVar2 + (pTVar5->testCases).failed;
      pIVar3 = (this->m_reporter).m_p;
      (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
                (pIVar3,local_68,pTVar5,&local_90,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      return pTVar5;
    }
  } while( true );
}

Assistant:

Totals runTest( const TestCaseInfo& testInfo ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            m_reporter->StartTestCase( testInfo );

            m_runningTest = new RunningTest( &testInfo );

            do {
                do {
                    m_currentResult.setLineInfo( m_runningTest->getTestCaseInfo().getLineInfo() );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            delete m_runningTest;
            m_runningTest = NULL;

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->EndTestCase( testInfo, deltaTotals, redirectedCout, redirectedCerr );
            return deltaTotals;
        }